

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O2

void Abc_NtkCountNodes(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *p;
  void *pvVar1;
  int i;
  double dVar2;
  
  if (pNtk->pDesign == (Abc_Des_t *)0x0) {
    dVar2 = (double)pNtk->nObjCounts[7];
  }
  else {
    p = pNtk->pDesign->vModules;
    for (i = 0; i < p->nSize; i = i + 1) {
      pvVar1 = Vec_PtrEntry(p,i);
      *(undefined8 *)((long)pvVar1 + 0xd0) = 0xbff0000000000000;
    }
    dVar2 = Abc_NtkCountNodes_rec(pNtk);
  }
  printf("Nodes = %.0f\n",dVar2);
  return;
}

Assistant:

void Abc_NtkCountNodes( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods;
    Abc_Ntk_t * pModel;
    double Counter;
    int i;

    if ( pNtk->pDesign == NULL )
        Counter = Abc_NtkNodeNum(pNtk);
    else
    {
        vMods = pNtk->pDesign->vModules;
        Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
            pModel->dTemp = -1;
        Counter = Abc_NtkCountNodes_rec( pNtk );
    }
    printf( "Nodes = %.0f\n", Counter );
}